

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::
     PostWalker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
     ::operator()(Collector *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  SIMDExtract *pSVar2;
  ArrayInit *pAVar3;
  SIMDLoad *pSVar4;
  GlobalSet *pGVar5;
  AtomicCmpxchg *pAVar6;
  Return *pRVar7;
  MemoryCopy *pMVar8;
  AtomicWait *pAVar9;
  TupleMake *pTVar10;
  Load *pLVar11;
  CallRef *pCVar12;
  Call *pCVar13;
  StructNew *pSVar14;
  ArrayNew *pAVar15;
  ArrayNewFixed *pAVar16;
  Expression **ppEVar17;
  Break *pBVar18;
  Switch *pSVar19;
  CallIndirect *pCVar20;
  Try *pTVar21;
  Store *pSVar22;
  Throw *pTVar23;
  MemoryGrow *pMVar24;
  StringNew *pSVar25;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  Expression **currp_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_01;
  Expression **currp_02;
  Expression **currp_03;
  Name *currp_04;
  Expression **currp_05;
  Expression **currp_06;
  Expression **currp_07;
  PostWalker<Collector,_wasm::Visitor<Collector,_void>_> *pPVar26;
  ulong uVar27;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar27 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case IfId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,(TaskFunc)&pMVar8->size,currp_02);
    goto LAB_008b398b;
  case LoopId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_008b34b2;
  case BreakId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pBVar18 = Expression::cast<wasm::Break>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,(TaskFunc)&pBVar18->condition,currp_00);
    ppEVar17 = &pBVar18->value;
    currp_01 = extraout_RDX_01;
    goto LAB_008b3484;
  case SwitchId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pSVar19 = Expression::cast<wasm::Switch>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,operator(),&pSVar19->condition);
    ppEVar17 = &pSVar19->value;
    currp_01 = extraout_RDX_02;
    goto LAB_008b3484;
  case CallId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pCVar13 = Expression::cast<wasm::Call>(this);
    uVar27 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case CallIndirectId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pCVar20 = Expression::cast<wasm::CallIndirect>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,operator(),&pCVar20->target);
    uVar27 = (ulong)(uint)(pCVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar20->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case LocalGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_008b37ff;
  case GlobalGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pGVar5 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_008b34b2;
  case LoadId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pLVar11 = Expression::cast<wasm::Load>(this);
    ppEVar17 = &pLVar11->ptr;
    break;
  case StoreId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_008b37c2;
  case ConstId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_008b37ff;
  case BinaryId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_008b3a02;
  case SelectId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_008b3517;
  case DropId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::Drop>(this);
    goto LAB_008b39d7;
  case ReturnId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pRVar7 = Expression::cast<wasm::Return>(this);
    ppEVar17 = &pRVar7->value;
    currp_01 = extraout_RDX;
    goto LAB_008b3484;
  case MemorySizeId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_008b39d7;
  case NopId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_008b3889;
  case AtomicCmpxchgId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar6 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_008b386c;
  case AtomicWaitId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_008b31a6;
  case AtomicNotifyId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_008b3a02;
  case AtomicFenceId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar2 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_008b37ff;
  case SIMDReplaceId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    currp_04 = (Name *)&pAVar9->timeout;
    goto LAB_008b3a10;
  case SIMDShuffleId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_008b398b;
  case SIMDTernaryId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_008b31a6;
  case SIMDShiftId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_008b3a02;
  case SIMDLoadId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar4 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_008b3685;
  case SIMDLoadStoreLaneId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_008b37c2:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 &pSVar22->value);
    ppEVar17 = &pSVar22->ptr;
    break;
  case MemoryInitId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
LAB_008b386c:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pAVar6->replacement);
    goto LAB_008b3889;
  case DataDropId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_008b3517;
  case MemoryFillId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_008b3517;
  case PopId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_008b39d7;
  case RefFuncId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_008b398b;
  case TableGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_008b34b2:
    ppEVar17 = &pGVar5->value;
    break;
  case TableSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_008b3889;
  case TableSizeId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
LAB_008b3889:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 &pAVar6->expected);
    ppEVar17 = &pAVar6->ptr;
    break;
  case TryId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pTVar21 = Expression::cast<wasm::Try>(this);
    uVar27 = (ulong)(uint)(pTVar21->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar21->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    ppEVar17 = &pTVar21->body;
    break;
  case ThrowId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar27 = (ulong)(uint)(pTVar23->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar23->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case RethrowId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case TupleMakeId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pTVar10 = Expression::cast<wasm::TupleMake>(this);
    uVar27 = (ulong)(uint)(pTVar10->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar10->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case TupleExtractId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_008b39d7;
  case I31NewId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31New>(this);
    goto LAB_008b39d7;
  case I31GetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31Get>(this);
    goto LAB_008b39d7;
  case CallRefId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pCVar12 = Expression::cast<wasm::CallRef>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,operator(),&pCVar12->target);
    uVar27 = (ulong)(uint)(pCVar12->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar12->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case RefTestId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefTest>(this);
    goto LAB_008b39d7;
  case RefCastId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefCast>(this);
    goto LAB_008b39d7;
  case BrOnId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar4 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_008b3685:
    ppEVar17 = &pSVar4->ptr;
    break;
  case StructNewId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pSVar14 = Expression::cast<wasm::StructNew>(this);
    uVar27 = (ulong)(uint)(pSVar14->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar14->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case StructGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_008b37ff;
  case StructSetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_008b3a02;
  case ArrayNewId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pAVar15 = Expression::cast<wasm::ArrayNew>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,operator(),&pAVar15->size);
    ppEVar17 = &pAVar15->init;
    currp_01 = extraout_RDX_00;
LAB_008b3484:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,(TaskFunc)ppEVar17,
                 currp_01);
    return;
  case ArrayNewSegId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar3 = (ArrayInit *)Expression::cast<wasm::ArrayNewSeg>(this);
    goto LAB_008b3347;
  case ArrayNewFixedId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pAVar16 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar27 = (ulong)(uint)(pAVar16->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar16->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
      ::operator()(pPVar26,operator(),ppEVar17);
    }
    return;
  case ArrayGetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_008b398b;
  case ArraySetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_008b3517;
  case ArrayLenId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_008b39d7;
  case ArrayCopyId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,operator(),(Expression **)&(pMVar8->destMemory).super_IString.str._M_str);
    goto LAB_008b3157;
  case ArrayFillId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_008b3157:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pMVar8->destMemory);
    goto LAB_008b3517;
  case ArrayInitId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pAVar3 = Expression::cast<wasm::ArrayInit>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,operator(),&pAVar3->size);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,operator(),&pAVar3->offset);
LAB_008b3347:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 &pAVar3->index);
    ppEVar17 = &pAVar3->ref;
    break;
  case RefAsId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_008b37ff;
  case StringNewId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pSVar25 = Expression::cast<wasm::StringNew>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,(TaskFunc)&pSVar25->end,currp_05);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,(TaskFunc)&pSVar25->start,currp_06);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,(TaskFunc)&pSVar25->length,currp_07);
    ppEVar17 = &pSVar25->ptr;
    break;
  case StringConstId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
    goto LAB_008b37ff;
  case StringEncodeId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
               super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>;
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                         ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(pPVar26,(TaskFunc)&pAVar9->timeout,currp_03);
    currp_04 = (Name *)&pAVar9->expected;
    goto LAB_008b3a10;
  case StringConcatId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_008b398b;
  case StringEqId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
    goto LAB_008b3a02;
  case StringAsId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringAs>(this);
LAB_008b37ff:
    ppEVar17 = &pSVar2->vec;
    break;
  case StringWTF8AdvanceId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF8Advance>(this);
LAB_008b3517:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 &pMVar8->size);
    goto LAB_008b398b;
  case StringWTF16GetId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_008b398b;
  case StringIterNextId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::StringIterNext>(this);
LAB_008b39d7:
    ppEVar17 = &pMVar24->delta;
    break;
  case StringIterMoveId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringIterMove>(this);
LAB_008b3a02:
    currp_04 = (Name *)&pAVar9->expected;
LAB_008b3a10:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)currp_04);
    ppEVar17 = &pAVar9->ptr;
    break;
  case StringSliceWTFId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_008b31a6:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 (Expression **)&pAVar9->timeout);
    currp_04 = (Name *)&pAVar9->expected;
    goto LAB_008b3a10;
  case StringSliceIterId:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,
                 Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
                 ::operator(),currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringSliceIter>(this);
LAB_008b398b:
    Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
    ::operator()(&(self->
                  super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                  super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),
                 &pMVar8->source);
    ppEVar17 = &pMVar8->dest;
    break;
  default:
    return;
  }
  Walker<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,wasm::Visitor<wasm::MemoryPacking::getSegmentReferrers(wasm::Module*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::unordered_map<wasm::Name,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>>>&)const::Collector,void>>
  ::operator()(&(self->
                super_WalkerPass<wasm::PostWalker<Collector,_wasm::Visitor<Collector,_void>_>_>).
                super_PostWalker<Collector,_wasm::Visitor<Collector,_void>_>,operator(),ppEVar17);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }